

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRVersion.cpp
# Opt level: O1

Version * ZXing::QRCode::Version::Micro(int number)

{
  int iVar1;
  Version *pVVar2;
  long lVar3;
  int *piVar4;
  undefined4 *puVar5;
  array<ZXing::QRCode::ECBlocks,_4UL> *paVar6;
  byte bVar7;
  array<ZXing::QRCode::ECBlocks,_4UL> aStack_158;
  array<ZXing::QRCode::ECBlocks,_4UL> local_108;
  array<ZXing::QRCode::ECBlocks,_4UL> local_b8;
  array<ZXing::QRCode::ECBlocks,_4UL> local_68;
  
  bVar7 = 0;
  if (Micro(int)::allVersions == '\0') {
    iVar1 = __cxa_guard_acquire(&Micro(int)::allVersions);
    if (iVar1 != 0) {
      piVar4 = &DAT_001a10fc;
      paVar6 = &local_68;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Micro::allVersions,1,&local_68);
      piVar4 = &DAT_001a114c;
      paVar6 = &local_b8;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Micro::allVersions + 1,2,&local_b8);
      piVar4 = &DAT_001a119c;
      paVar6 = &local_108;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        paVar6->_M_elems[0].codewordsPerBlock = *piVar4;
        piVar4 = piVar4 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + (ulong)bVar7 * -8 + 4);
      }
      Version(Micro::allVersions + 2,3,&local_108);
      puVar5 = &DAT_001a11ec;
      paVar6 = &aStack_158;
      for (lVar3 = 0x14; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)paVar6 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar7 * -2 + 1;
        paVar6 = (array<ZXing::QRCode::ECBlocks,_4UL> *)((long)paVar6 + ((ulong)bVar7 * -2 + 1) * 4)
        ;
      }
      Version(Micro::allVersions + 3,4,&aStack_158);
      __cxa_atexit(__cxx_global_array_dtor_64,0,&__dso_handle);
      __cxa_guard_release(&Micro(int)::allVersions);
    }
  }
  pVVar2 = (Version *)0x0;
  if (0xfffffffb < number - 5U) {
    pVVar2 = (Version *)
             &Model2::allVersions[(ulong)(uint)number + 0x27]._alignmentPatternCenters.
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  return pVVar2;
}

Assistant:

const Version* Version::Micro(int number)
{
	/**
	 * See ISO 18004:2006 6.5.1 Table 9
	 */
	static const Version allVersions[] = {
		{1, {2, 1, 3, 0, 0}},
		{2, {5, 1, 5, 0, 0, 6, 1, 4, 0, 0}},
		{3, {6, 1, 11, 0, 0, 8, 1, 9, 0, 0}},
		{4, {8, 1, 16, 0, 0, 10, 1, 14, 0, 0, 14, 1, 10, 0, 0}}};

	if (number < 1 || number > 4)
		return nullptr;
	return allVersions + number - 1;
}